

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUIAbout.cpp
# Opt level: O1

void __thiscall GUIAbout::GUIAbout(GUIAbout *this)

{
  QTextDocument *this_00;
  QTextBrowser *this_01;
  WidgetAttribute WVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString html;
  QVBoxLayout layout;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QString local_58;
  QArrayData *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  QDialog::QDialog(&this->super_QDialog,0,0);
  *(undefined ***)this = &PTR_metaObject_00120ae8;
  *(undefined ***)&this->field_0x10 = &PTR__GUIAbout_00120cc0;
  QDialog::setModal(SUB81(this,0));
  WVar1 = (WidgetAttribute)this;
  QWidget::setMinimumSize(WVar1,500);
  QWidget::setMaximumSize(WVar1,500);
  QVar2.m_data = (storage_type *)0x1;
  QVar2.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar2);
  local_78 = local_40;
  uStack_70 = uStack_38;
  local_68 = local_30;
  QWidget::setWindowTitle((QString *)this);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  QWidget::setAttribute(WVar1,true);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)&local_40,(QWidget *)this);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QVar3.m_data = (storage_type *)0x30;
  QVar3.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar3);
  QString::append(&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x3c;
  QVar4.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar4);
  QString::append(&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_00,(QObject *)this);
  QTextDocument::setHtml((QString *)this_00);
  this_01 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(this_01,(QWidget *)this);
  QTextEdit::setDocument((QTextDocument *)this_01);
  QBoxLayout::addWidget(&local_40,this_01,0,0);
  QWidget::show();
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QVBoxLayout::~QVBoxLayout((QVBoxLayout *)&local_40);
  return;
}

Assistant:

GUIAbout::GUIAbout()
{
    setModal( true );
    setMinimumSize( 500, 170 );
    setMaximumSize( 500, 170 );
    setWindowTitle( " " );
    setAttribute( Qt::WA_DeleteOnClose );

    QVBoxLayout layout( this );
    QString html;

    html.append( "<br/><pre>  Author:       Przemyslaw Madej</pre>" );
    html.append( "<pre>  Web page:     http://przemeknet.pl/fifteen.html</pre>" );

    QTextDocument* doc = new QTextDocument( this );
    doc->setHtml( html );
    QTextBrowser* browser = new QTextBrowser( this );
    browser->setDocument( doc );
    layout.addWidget( browser );
    show();
}